

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

int __thiscall jpgd::jpeg_decoder::huff_decode(jpeg_decoder *this,huff_tables *pH)

{
  int iVar1;
  uint num_bits;
  uint uVar2;
  ulong uVar3;
  
  if (pH != (huff_tables *)0x0) {
    uVar2 = pH->look_up[this->m_bit_buf >> 0x18];
    uVar3 = (ulong)(int)uVar2;
    if ((long)uVar3 < 0) {
      iVar1 = -8;
      do {
        uVar2 = -(uint)((this->m_bit_buf >> (iVar1 + 0x1fU & 0x1f) & 1) != 0) - (int)uVar3;
        if (((int)(iVar1 + 0x1fU) < 0) || (0x1ff < uVar2)) goto LAB_0014071e;
        uVar2 = pH->tree[uVar2];
        uVar3 = (ulong)uVar2;
        iVar1 = iVar1 + -1;
      } while ((int)uVar2 < 0);
      num_bits = -iVar1;
    }
    else {
      if (0xff < uVar2) {
        __assert_fail("symbol < JPGD_HUFF_CODE_SIZE_MAX_LENGTH",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                      ,0x227,"int jpgd::jpeg_decoder::huff_decode(huff_tables *)");
      }
      num_bits = (uint)pH->code_size[uVar3];
    }
    get_bits_no_markers(this,num_bits);
    return uVar2;
  }
LAB_0014071e:
  stop_decoding(this,JPGD_DECODE_ERROR);
}

Assistant:

inline int jpeg_decoder::huff_decode(huff_tables* pH)
	{
		if (!pH)
			stop_decoding(JPGD_DECODE_ERROR);

		int symbol;
		// Check first 8-bits: do we have a complete symbol?
		if ((symbol = pH->look_up[m_bit_buf >> 24]) < 0)
		{
			// Decode more bits, use a tree traversal to find symbol.
			int ofs = 23;
			do
			{
				unsigned int idx = -(int)(symbol + ((m_bit_buf >> ofs) & 1));

				// This should never happen, but to be safe I'm turning these asserts into a run-time check.
				if ((idx >= JPGD_HUFF_TREE_MAX_LENGTH) || (ofs < 0))
					stop_decoding(JPGD_DECODE_ERROR);

				symbol = pH->tree[idx];
				ofs--;
			} while (symbol < 0);

			get_bits_no_markers(8 + (23 - ofs));
		}
		else
		{
			assert(symbol < JPGD_HUFF_CODE_SIZE_MAX_LENGTH);
			get_bits_no_markers(pH->code_size[symbol]);
		}

		return symbol;
	}